

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * exprDup(sqlite3 *db,Expr *p,int dupFlags,u8 **pzBuffer)

{
  sqlite3 *db_00;
  u8 **ppuVar1;
  int iVar2;
  Expr *pOwner;
  size_t sVar3;
  Select *pSVar4;
  Expr *pEVar5;
  Window *pWVar6;
  uint uVar7;
  u8 **pzBuffer_00;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  u8 *local_50;
  uint local_44;
  sqlite3 *local_40;
  u8 **local_38;
  
  if (pzBuffer == (u8 **)0x0) {
    iVar2 = dupedExprSize(p,dupFlags);
    pOwner = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar2);
    local_44 = 0;
  }
  else {
    pOwner = (Expr *)*pzBuffer;
    local_44 = 0x8000;
  }
  if (pOwner == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  uVar8 = 0x50;
  if ((((dupFlags != 0) && (p->op != 0xa6)) && (p->pWin == (Window *)0x0)) &&
     (uVar8 = 0x202c, p->pLeft == (Expr *)0x0)) {
    uVar8 = 0x202c;
    if ((p->x).pList == (ExprList *)0x0) {
      uVar8 = 0x4010;
    }
  }
  uVar9 = p->flags;
  uVar10 = 0;
  local_40 = db;
  local_38 = pzBuffer;
  if (((uVar9 >> 10 & 1) == 0) && ((p->u).zToken != (char *)0x0)) {
    sVar3 = strlen((p->u).zToken);
    uVar10 = ((uint)sVar3 & 0x3fffffff) + 1;
  }
  if (dupFlags == 0) {
    uVar7 = 0x2c;
    if ((uVar9 >> 0xd & 1) == 0) {
      uVar7 = 0x50;
    }
    sVar3 = 0x10;
    if ((uVar9 >> 0xe & 1) == 0) {
      sVar3 = (size_t)uVar7;
    }
    memcpy(pOwner,p,sVar3);
    if ((uint)sVar3 < 0x50) {
      memset(&pOwner->op + sVar3,0,0x50 - sVar3);
    }
  }
  else {
    memcpy(pOwner,p,(ulong)(uVar8 & 0x7c));
  }
  uVar9 = uVar8 & 0x6000 | local_44 | pOwner->flags & 0xfffe1fff;
  pOwner->flags = uVar9;
  if (uVar10 != 0) {
    (pOwner->u).zToken = (char *)(&pOwner->op + (uVar8 & 0x7c));
    memcpy(&pOwner->op + (uVar8 & 0x7c),(p->u).zToken,(ulong)uVar10);
    uVar9 = pOwner->flags;
  }
  ppuVar1 = local_38;
  db_00 = local_40;
  if (((uVar9 | p->flags) & 0x804000) == 0) {
    if ((p->flags >> 0xb & 1) == 0) {
      pSVar4 = (Select *)sqlite3ExprListDup(local_40,(p->x).pList,dupFlags);
    }
    else {
      pSVar4 = sqlite3SelectDup(local_40,(Select *)(p->x).pList,dupFlags);
    }
    (pOwner->x).pList = (ExprList *)pSVar4;
  }
  iVar2 = dupedExprNodeSize(p,dupFlags);
  local_50 = &pOwner->op + iVar2;
  if ((pOwner->flags & 0x6000) == 0) {
    uVar8 = p->flags;
    if ((uVar8 & 0x6000) == 0) {
      pWVar6 = sqlite3WindowDup(db_00,pOwner,p->pWin);
      uVar8 = p->flags;
    }
    else {
      pWVar6 = (Window *)0x0;
    }
    pOwner->pWin = pWVar6;
    if ((uVar8 & 0x804000) != 0) goto LAB_00178eff;
    pEVar5 = p->pLeft;
    if (pOwner->op != 0xa6) {
      if (pEVar5 == (Expr *)0x0) {
        pEVar5 = (Expr *)0x0;
      }
      else {
        pEVar5 = exprDup(db_00,pEVar5,0,(u8 **)0x0);
      }
    }
    pOwner->pLeft = pEVar5;
    pEVar5 = p->pRight;
    if (pEVar5 != (Expr *)0x0) {
      iVar2 = 0;
      pzBuffer_00 = (u8 **)0x0;
      goto LAB_00178ef2;
    }
LAB_00178ef9:
    pEVar5 = (Expr *)0x0;
  }
  else {
    if ((pOwner->flags & 0x804000) != 0) goto LAB_00178eff;
    if (p->pLeft == (Expr *)0x0) {
      pEVar5 = (Expr *)0x0;
    }
    else {
      pEVar5 = exprDup(db_00,p->pLeft,1,&local_50);
    }
    pOwner->pLeft = pEVar5;
    pEVar5 = p->pRight;
    if (pEVar5 == (Expr *)0x0) goto LAB_00178ef9;
    pzBuffer_00 = &local_50;
    iVar2 = 1;
LAB_00178ef2:
    pEVar5 = exprDup(db_00,pEVar5,iVar2,pzBuffer_00);
  }
  pOwner->pRight = pEVar5;
LAB_00178eff:
  if (ppuVar1 != (u8 **)0x0) {
    *ppuVar1 = local_50;
  }
  return pOwner;
}

Assistant:

static Expr *exprDup(sqlite3 *db, Expr *p, int dupFlags, u8 **pzBuffer){
  Expr *pNew;           /* Value to return */
  u8 *zAlloc;           /* Memory space from which to build Expr object */
  u32 staticFlag;       /* EP_Static if space not obtained from malloc */

  assert( db!=0 );
  assert( p );
  assert( dupFlags==0 || dupFlags==EXPRDUP_REDUCE );
  assert( pzBuffer==0 || dupFlags==EXPRDUP_REDUCE );

  /* Figure out where to write the new Expr structure. */
  if( pzBuffer ){
    zAlloc = *pzBuffer;
    staticFlag = EP_Static;
  }else{
    zAlloc = sqlite3DbMallocRawNN(db, dupedExprSize(p, dupFlags));
    staticFlag = 0;
  }
  pNew = (Expr *)zAlloc;

  if( pNew ){
    /* Set nNewSize to the size allocated for the structure pointed to
    ** by pNew. This is either EXPR_FULLSIZE, EXPR_REDUCEDSIZE or
    ** EXPR_TOKENONLYSIZE. nToken is set to the number of bytes consumed
    ** by the copy of the p->u.zToken string (if any).
    */
    const unsigned nStructSize = dupedExprStructSize(p, dupFlags);
    const int nNewSize = nStructSize & 0xfff;
    int nToken;
    if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
      nToken = sqlite3Strlen30(p->u.zToken) + 1;
    }else{
      nToken = 0;
    }
    if( dupFlags ){
      assert( ExprHasProperty(p, EP_Reduced)==0 );
      memcpy(zAlloc, p, nNewSize);
    }else{
      u32 nSize = (u32)exprStructSize(p);
      memcpy(zAlloc, p, nSize);
      if( nSize<EXPR_FULLSIZE ){ 
        memset(&zAlloc[nSize], 0, EXPR_FULLSIZE-nSize);
      }
    }

    /* Set the EP_Reduced, EP_TokenOnly, and EP_Static flags appropriately. */
    pNew->flags &= ~(EP_Reduced|EP_TokenOnly|EP_Static|EP_MemToken);
    pNew->flags |= nStructSize & (EP_Reduced|EP_TokenOnly);
    pNew->flags |= staticFlag;

    /* Copy the p->u.zToken string, if any. */
    if( nToken ){
      char *zToken = pNew->u.zToken = (char*)&zAlloc[nNewSize];
      memcpy(zToken, p->u.zToken, nToken);
    }

    if( 0==((p->flags|pNew->flags) & (EP_TokenOnly|EP_Leaf)) ){
      /* Fill in the pNew->x.pSelect or pNew->x.pList member. */
      if( ExprHasProperty(p, EP_xIsSelect) ){
        pNew->x.pSelect = sqlite3SelectDup(db, p->x.pSelect, dupFlags);
      }else{
        pNew->x.pList = sqlite3ExprListDup(db, p->x.pList, dupFlags);
      }
    }

    /* Fill in pNew->pLeft and pNew->pRight. */
    zAlloc += dupedExprNodeSize(p, dupFlags);
    if( ExprHasProperty(pNew, EP_Reduced|EP_TokenOnly) ){
      if( !ExprHasProperty(pNew, EP_TokenOnly|EP_Leaf) ){
        pNew->pLeft = p->pLeft ?
                      exprDup(db, p->pLeft, EXPRDUP_REDUCE, &zAlloc) : 0;
        pNew->pRight = p->pRight ?
                       exprDup(db, p->pRight, EXPRDUP_REDUCE, &zAlloc) : 0;
      }
    }else{
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(p, EP_Reduced|EP_TokenOnly) ){
        pNew->pWin = 0;
      }else{
        pNew->pWin = sqlite3WindowDup(db, pNew, p->pWin);
      }
#endif /* SQLITE_OMIT_WINDOWFUNC */
      if( !ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
        if( pNew->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->iColumn==0 || p->pRight==0 );
          assert( p->pRight==0  || p->pRight==p->pLeft );
        }else{
          pNew->pLeft = sqlite3ExprDup(db, p->pLeft, 0);
        }
        pNew->pRight = sqlite3ExprDup(db, p->pRight, 0);
      }
    }
    if( pzBuffer ){
      *pzBuffer = zAlloc;
    }
  }
  return pNew;
}